

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall Server::Private::Private(Private *this)

{
  TimerImpl *local_30;
  long local_28 [3];
  Private *local_10;
  Private *this_local;
  
  this->_keepAlive = false;
  this->_noDelay = false;
  this->_sendBufferSize = 0;
  this->_receiveBufferSize = 0;
  this->_reuseAddress = true;
  local_10 = this;
  Socket::Poll::Poll(&this->_sockets);
  MultiMap<long,_Server::Private::TimerImpl_*>::MultiMap(&this->_queuedTimers);
  PoolList<Server::Private::ListenerImpl>::PoolList(&this->_listeners);
  PoolList<Server::Private::EstablisherImpl>::PoolList(&this->_establishers);
  PoolList<Server::Private::ClientImpl>::PoolList(&this->_clients);
  PoolList<Server::Private::TimerImpl>::PoolList(&this->_timers);
  PoolList<Server::Private::Resolver>::PoolList(&this->_resolvers);
  HashSet<Server::Private::ClientImpl_*>::HashSet(&this->_closingClients,8);
  Mutex::Mutex(&this->_interruptMutex);
  this->_interrupted = false;
  local_28[0] = 0;
  local_30 = (TimerImpl *)0x0;
  MultiMap<long,_Server::Private::TimerImpl_*>::insert(&this->_queuedTimers,local_28,&local_30);
  return;
}

Assistant:

Server::Private::Private() : _keepAlive(false), _noDelay(false), _sendBufferSize(0), _receiveBufferSize(0), _reuseAddress(true), _closingClients(8), _interrupted(false)
{
  _queuedTimers.insert(0, 0); // add default timeout timer
}